

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O0

HttpResponse * __thiscall HttpResponse::GetHttpStatusCode_abi_cxx11_(HttpResponse *this)

{
  long in_RSI;
  HttpResponse *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)(in_RSI + 8));
  return this;
}

Assistant:

string HttpResponse::GetHttpStatusCode() {
  return _httpStatusCode;
}